

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::deleteElement(SurfaceMesh *this,Edge e)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t __n;
  reference pvVar2;
  SurfaceMesh *in_RDI;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff0c;
  allocator local_d9;
  string local_d8 [160];
  string local_38 [40];
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_10;
  
  bVar1 = usesImplicitTwin(in_RDI);
  if (!bVar1) {
    Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::getIndex
              (&local_10);
    this_00 = &in_RDI->eHalfedgeArr;
    __n = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::getIndex
                    (&local_10);
    pvVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,__n);
    *pvVar2 = 0xffffffffffffffff;
    in_RDI->nEdgesCount = in_RDI->nEdgesCount - 1;
    in_RDI->modificationTick = in_RDI->modificationTick + 1;
    in_RDI->isCompressedFlag = false;
    return;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/surface_mesh.cpp"
             ,&local_d9);
  ::std::operator+((char *)__lhs,in_stack_fffffffffffffec0);
  ::std::operator+(__lhs,(char *)in_stack_fffffffffffffec0);
  ::std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  ::std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ::std::operator+(__lhs,(char *)in_stack_fffffffffffffec0);
  ::std::operator+(__lhs,(char *)in_stack_fffffffffffffec0);
  ::std::runtime_error::runtime_error((runtime_error *)__lhs,local_38);
  __cxa_throw(__lhs,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SurfaceMesh::deleteElement(Edge e) {
  GC_SAFETY_ASSERT(!usesImplicitTwin(), "cannot delete a single edge with implict twin");

  size_t i = e.getIndex();
  eHalfedgeArr[e.getIndex()] = INVALID_IND;
  nEdgesCount--;

  modificationTick++;
  isCompressedFlag = false;
}